

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O0

int checkForTemps(LayerStack *g,uint64_t seed,int x,int z,int w,int h,int *tc)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint64_t s;
  size_t __nmemb;
  Layer *layer;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  long in_stack_00000008;
  int t;
  int id;
  int ret;
  int *area;
  int ccnt [9];
  Layer *l;
  int scnt;
  int j;
  int i;
  uint64_t ss;
  uint64_t ls;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  Layer *in_stack_ffffffffffffff80;
  int local_78 [10];
  long local_50;
  int local_44;
  int local_40;
  int local_3c;
  uint64_t local_38;
  uint64_t local_30;
  int local_28;
  int local_24;
  long local_10;
  
  local_28 = in_R9D;
  local_24 = in_R8D;
  local_10 = in_RDI;
  local_30 = getLayerSalt(CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  local_38 = getStartSeed(CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                          CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  local_44 = 0;
  if (0 < *(int *)(in_stack_00000008 + 0x18)) {
    local_44 = *(int *)(in_stack_00000008 + 0x18);
  }
  if (0 < *(int *)(in_stack_00000008 + 0x1c)) {
    local_44 = *(int *)(in_stack_00000008 + 0x1c) + local_44;
  }
  if (0 < *(int *)(in_stack_00000008 + 0x20)) {
    local_44 = *(int *)(in_stack_00000008 + 0x20) + local_44;
  }
  if (0 < local_44) {
    for (local_40 = 0; local_40 < local_28; local_40 = local_40 + 1) {
      for (local_3c = 0; local_3c < local_24; local_3c = local_3c + 1) {
        s = getChunkSeed(CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                         in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
        iVar2 = mcFirstIsZero(s,0xd);
        if (iVar2 != 0) {
          local_44 = local_44 + -1;
        }
      }
    }
    if (0 < local_44) {
      return 0;
    }
  }
  local_50 = local_10 + 0x3f0;
  memset(local_78,0,0x24);
  __nmemb = getMinLayerCacheSize
                      (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78
                      );
  layer = (Layer *)calloc(__nmemb,4);
  iVar2 = 1;
  setLayerSeed(layer,CONCAT44(1,in_stack_ffffffffffffff78));
  genArea(layer,(int *)CONCAT44(iVar2,in_stack_ffffffffffffff78),in_stack_ffffffffffffff74,
          in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
  for (local_3c = 0; local_3c < local_24 * local_28; local_3c = local_3c + 1) {
    uVar1 = *(uint *)((long)&layer->getMap + (long)local_3c * 4);
    uVar3 = uVar1 & 0xff;
    if ((uVar1 != uVar3) && (uVar3 != 4)) {
      uVar3 = uVar3 + 5;
    }
    local_78[(int)uVar3] = local_78[(int)uVar3] + 1;
  }
  local_3c = 0;
  do {
    if (8 < local_3c) {
LAB_00116bc4:
      free(layer);
      return iVar2;
    }
    if ((local_78[local_3c] < *(int *)(in_stack_00000008 + (long)local_3c * 4)) ||
       ((local_78[local_3c] != 0 && (*(int *)(in_stack_00000008 + (long)local_3c * 4) < 0)))) {
      iVar2 = 0;
      goto LAB_00116bc4;
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

int checkForTemps(LayerStack *g, uint64_t seed, int x, int z, int w, int h, const int tc[9])
{
    uint64_t ls = getLayerSalt(3); // L_SPECIAL_1024 layer seed
    uint64_t ss = getStartSeed(seed, ls);

    int i, j;
    int scnt = 0;

    if (tc[Special+Warm] > 0) scnt += tc[Special+Warm];
    if (tc[Special+Lush] > 0) scnt += tc[Special+Lush];
    if (tc[Special+Cold] > 0) scnt += tc[Special+Cold];

    if (scnt > 0)
    {
        for (j = 0; j < h; j++)
        {
            for (i = 0; i < w; i++)
            {
                if (mcFirstIsZero(getChunkSeed(ss, x+i, z+j), 13))
                    scnt--;
            }
        }
        if (scnt > 0)
            return 0;
    }

    Layer *l = &g->layers[L_SPECIAL_1024];
    int ccnt[9] = {0};
    int *area = (int*) calloc(getMinLayerCacheSize(l, w, h), sizeof(int));
    int ret = 1;

    setLayerSeed(l, seed);
    genArea(l, area, x, z, w, h);

    for (i = 0; i < w*h; i++)
    {
        int id = area[i];
        int t = id & 0xff;
        if (id != t && t != Freezing)
            t += Special;
        ccnt[t]++;
    }
    for (i = 0; i < 9; i++)
    {
        if (ccnt[i] < tc[i] || (ccnt[i] && tc[i] < 0))
        {
            ret = 0;
            break;
        }
    }

    free(area);
    return ret;
}